

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Mat4x2 * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,11>
          (Mat4x2 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  undefined1 local_4c [8];
  undefined1 local_44 [8];
  Vector<float,_4> local_3c;
  Vector<float,_4> local_28;
  MatrixCaseUtils *pMStack_18;
  int inputNdx_local;
  ShaderEvalContext *evalCtx_local;
  Mat4x2 *m;
  
  local_28.m_data[3] = SUB84(evalCtx,0);
  local_28.m_data[2]._3_1_ = 0;
  pMStack_18 = this;
  evalCtx_local = (ShaderEvalContext *)__return_storage_ptr__;
  tcu::Matrix<float,_2,_4>::Matrix(__return_storage_ptr__);
  tcu::Vector<float,_4>::swizzle(&local_28,(int)pMStack_18 + 0x30,0);
  tcu::Matrix<float,_2,_4>::setColumn(__return_storage_ptr__,0,(Vector<float,_2> *)&local_28);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(local_44 + 8),(int)pMStack_18 + 0x40,0);
  tcu::Matrix<float,_2,_4>::setColumn(__return_storage_ptr__,1,(Vector<float,_2> *)(local_44 + 8));
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_44,(int)pMStack_18 + 0x50,0);
  tcu::Matrix<float,_2,_4>::setColumn(__return_storage_ptr__,2,(Vector<float,_2> *)local_44);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_4c,(int)pMStack_18 + 0x60,0);
  tcu::Matrix<float,_2,_4>::setColumn(__return_storage_ptr__,3,(Vector<float,_2> *)local_4c);
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat4x2 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT4X2> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat4x2 m;
	m.setColumn(0, evalCtx.in[0].swizzle(0,1));
	m.setColumn(1, evalCtx.in[1].swizzle(0,1));
	m.setColumn(2, evalCtx.in[2].swizzle(0,1));
	m.setColumn(3, evalCtx.in[3].swizzle(0,1));
	return m;
}